

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_stream.cpp
# Opt level: O3

void __thiscall mpt::io::stream::sync(stream *this)

{
  sync((stream *)&this[-1]._inputFile);
  return;
}

Assistant:

int io::stream::sync(int timeout)
{
	if (!_srm) {
		return BadArgument;
	}
	if (mpt_stream_flush(_srm) < 0) {
		return BadOperation;
	}
	if (!_idlen) {
		return true;
	}
	return mpt_stream_sync(_srm, _idlen, &_wait, timeout);
}